

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int client_do_handle_certificate(ptls_t *tls,uint8_t *src,uint8_t *end)

{
  int ret;
  int got_certs;
  int *in_stack_00000208;
  uint8_t *in_stack_00000210;
  uint8_t *in_stack_00000218;
  ptls_t *in_stack_00000220;
  undefined4 local_24;
  undefined4 local_4;
  
  local_4 = handle_certificate(in_stack_00000220,in_stack_00000218,in_stack_00000210,
                               in_stack_00000208);
  if (local_4 == 0) {
    if (local_24 == 0) {
      local_4 = 0x2f;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int client_do_handle_certificate(ptls_t *tls, const uint8_t *src, const uint8_t *end)
{
    int got_certs, ret;

    if ((ret = handle_certificate(tls, src, end, &got_certs)) != 0)
        return ret;
    if (!got_certs)
        return PTLS_ALERT_ILLEGAL_PARAMETER;

    return 0;
}